

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_internal_impl.hpp
# Opt level: O3

iter_result_opt_conflict * __thiscall
unodb::detail::
basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
::next(iter_result_opt_conflict *__return_storage_ptr__,
      basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
      *this,node_type type,uint8_t child_index)

{
  long lVar1;
  char *pcVar2;
  byte bVar3;
  key_prefix<unodb::detail::basic_art_key<unsigned_long>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>::critical_section_policy>
  kVar4;
  ulong uVar5;
  undefined7 in_register_00000011;
  ulong uVar6;
  
  switch(CONCAT71(in_register_00000011,type) & 0xffffffff) {
  case 0:
    __assert_fail("type != node_type::LEAF",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal_impl.hpp"
                  ,0x3f3,
                  "iter_result_opt unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned long, std::span<const std::byte>, unodb::db, unodb::in_fake_critical_section, unodb::fake_lock, unodb::fake_read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::node_header>, unodb::detail::inode_defs, unodb::detail::db_inode_deleter, unodb::detail::basic_db_leaf_deleter>>::next(node_type, std::uint8_t) [ArtPolicy = unodb::detail::basic_art_policy<unsigned long, std::span<const std::byte>, unodb::db, unodb::in_fake_critical_section, unodb::fake_lock, unodb::fake_read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::node_header>, unodb::detail::inode_defs, unodb::detail::db_inode_deleter, unodb::detail::basic_db_leaf_deleter>]"
                 );
  case 1:
    if ((this->children_count).value <= (byte)(child_index + 1)) {
LAB_0013c464:
      (__return_storage_ptr__->
      super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>).
      _M_payload.
      super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>.
      _M_payload._M_value.node.tagged_ptr = 0;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->
               super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>
               )._M_payload.
               super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>
               ._M_payload + 8) = 0;
      (__return_storage_ptr__->
      super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>).
      _M_payload.
      super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>.
      _M_payload._M_value.prefix.u64 = 0;
      *(undefined8 *)
       &(__return_storage_ptr__->
        super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>).
        _M_payload.
        super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>.
        _M_engaged = 0;
      return __return_storage_ptr__;
    }
    bVar3 = (&this->field_0xc)[(byte)(child_index + 1)];
    kVar4 = this->k_prefix;
    uVar6 = (ulong)this | 1;
    break;
  case 2:
    if ((this->children_count).value <= (byte)(child_index + 1)) goto LAB_0013c464;
    bVar3 = *(byte *)((long)&this[1].k_prefix + (ulong)(byte)(child_index + 1));
    kVar4 = this->k_prefix;
    uVar6 = (ulong)this | 2;
    break;
  case 3:
    uVar6 = (ulong)child_index;
    do {
      if (uVar6 == 0xff) goto LAB_0013c464;
      uVar5 = uVar6 + 1;
      pcVar2 = &this->field_0xa + uVar6;
      uVar6 = uVar5;
    } while (*pcVar2 == -1);
    kVar4 = this->k_prefix;
    uVar6 = (ulong)this | 3;
    goto LAB_0013c451;
  case 4:
    uVar6 = (ulong)child_index;
    do {
      if (uVar6 == 0xff) goto LAB_0013c464;
      uVar5 = uVar6 + 1;
      lVar1 = uVar6 * 8;
      uVar6 = uVar5;
    } while (*(long *)(&this[1].children_count + lVar1) == 0);
    kVar4 = this->k_prefix;
    uVar6 = (ulong)this | 4;
LAB_0013c451:
    (__return_storage_ptr__->
    super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>).
    _M_payload.super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>
    ._M_payload._M_value.node.tagged_ptr = uVar6;
    (__return_storage_ptr__->
    super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>).
    _M_payload.super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>
    ._M_payload._M_value.key_byte = (byte)uVar5;
    (__return_storage_ptr__->
    super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>).
    _M_payload.super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>
    ._M_payload._M_value.child_index = (byte)uVar5;
    (__return_storage_ptr__->
    super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>).
    _M_payload.super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>
    ._M_payload._M_value.prefix = (key_prefix_snapshot)kVar4;
    goto LAB_0013c45e;
  default:
    basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,std::span<std::byte_const,18446744073709551615ul>,unodb::db,unodb::in_fake_critical_section,unodb::fake_lock,unodb::fake_read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::node_header>,unodb::detail::inode_defs,unodb::detail::db_inode_deleter,unodb::detail::basic_db_leaf_deleter>>
    ::next();
  }
  (__return_storage_ptr__->
  super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>).
  _M_payload.super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>.
  _M_payload._M_value.node.tagged_ptr = uVar6;
  (__return_storage_ptr__->
  super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>).
  _M_payload.super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>.
  _M_payload._M_value.key_byte = bVar3;
  (__return_storage_ptr__->
  super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>).
  _M_payload.super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>.
  _M_payload._M_value.child_index = child_index + '\x01';
  (__return_storage_ptr__->
  super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>).
  _M_payload.super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>.
  _M_payload._M_value.prefix = (key_prefix_snapshot)kVar4;
LAB_0013c45e:
  (__return_storage_ptr__->
  super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>).
  _M_payload.super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>.
  _M_engaged = true;
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard, gnu::pure]] constexpr iter_result_opt next(
      node_type type, std::uint8_t child_index) noexcept {
    UNODB_DETAIL_ASSERT(type != node_type::LEAF);
    switch (type) {
      case node_type::I4:
        return static_cast<inode4_type *>(this)->next(child_index);
      case node_type::I16:
        return static_cast<inode16_type *>(this)->next(child_index);
      case node_type::I48:
        return static_cast<inode48_type *>(this)->next(child_index);
      case node_type::I256:
        return static_cast<inode256_type *>(this)->next(child_index);
      // LCOV_EXCL_START
      case node_type::LEAF:
        UNODB_DETAIL_CANNOT_HAPPEN();
    }
    UNODB_DETAIL_CANNOT_HAPPEN();
    // LCOV_EXCL_STOP
  }